

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O3

string * __thiscall
Kernel::InferenceStore::TPTPProofPrinter::
getNewSymbols<Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>::ConstIterator>
          (string *__return_storage_ptr__,TPTPProofPrinter *this,string *origin,ConstIterator symIt)

{
  pair<Kernel::SymbolType,_unsigned_int> pVar1;
  pointer pcVar2;
  string *psVar3;
  long lVar4;
  pair<Kernel::SymbolType,_unsigned_int> *ppVar5;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *pSVar6;
  ostringstream symsStr;
  char local_1f9;
  TPTPProofPrinter *local_1f8;
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pSVar6 = symIt.super_ConstRefIterator._stack;
  ppVar5 = symIt.super_ConstRefIterator._pointer;
  local_1f8 = this;
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (pSVar6->_stack != ppVar5) {
    do {
      ppVar5 = ppVar5 + -1;
      pVar1 = *ppVar5;
      if (pVar1.first == PRED) {
        lVar4 = 0x80;
LAB_0053371e:
        psVar3 = *(string **)
                  (*(long *)((long)&(DAT_00b521b0->_dividesNvalues)._capacity + lVar4) +
                  ((long)pVar1 >> 0x20) * 8);
      }
      else {
        if (pVar1.first != FUNC) {
          lVar4 = 0xa0;
          goto LAB_0053371e;
        }
        psVar3 = Signature::functionName_abi_cxx11_(DAT_00b521b0,pVar1.second);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      if (ppVar5 == pSVar6->_stack) break;
      local_1f9 = ',';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1f9,1);
    } while (ppVar5 != pSVar6->_stack);
  }
  pcVar2 = (origin->_M_dataplus)._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + origin->_M_string_length);
  std::__cxx11::stringbuf::str();
  psVar3 = local_1f0;
  getNewSymbols(local_1f0,local_1f8,&local_1e8,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string getNewSymbols(std::string origin, It symIt) {
    std::ostringstream symsStr;
    while(symIt.hasNext()) {
      SymbolId sym = symIt.next();
      if (sym.first == SymbolType::FUNC ) {
        symsStr << env.signature->functionName(sym.second);
      } else if (sym.first == SymbolType::PRED){
        symsStr << env.signature->predicateName(sym.second);
      } else {
        symsStr << env.signature->typeConName(sym.second);
      }
      if (symIt.hasNext()) {
        symsStr << ',';
      }
    }
    return getNewSymbols(origin, symsStr.str());
  }